

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  cmsysProcess *cp;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  OutputOption OVar7;
  undefined8 uVar8;
  vector<char,std::allocator<char>> *pvVar9;
  string *cmd;
  pointer pbVar10;
  bool bVar11;
  cmProcessOutput processOutput;
  int length;
  char *data;
  string strdata;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  cmProcessOutput local_149;
  OutputOption local_148;
  int local_144;
  char *local_140;
  string local_138;
  void *local_118;
  undefined8 uStack_110;
  long local_108;
  void *local_f8;
  undefined8 uStack_f0;
  long local_e8;
  int *local_e0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d8;
  rep local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148 = outputflag;
  local_e0 = retVal;
  local_c0 = timeout.__r;
  local_b8 = dir;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_d8,
             ((long)(command->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(command->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar10 = (command->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar1) {
    do {
      local_138._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_138);
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar1);
  }
  local_138._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_138);
  cp = cmsysProcess_New();
  OVar7 = local_148;
  cmsysProcess_SetCommand
            (cp,local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,local_b8);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (OVar7 == OUTPUT_MERGE) {
LAB_00202d97:
    cmsysProcess_SetOption(cp,2,1);
LAB_00202da9:
    captureStdErr = (string *)0x0;
  }
  else if (OVar7 == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp,2,1);
    cmsysProcess_SetPipeShared(cp,3,1);
    captureStdErr = (string *)0x0;
    captureStdOut = (string *)0x0;
  }
  else {
    if (captureStdErr == (string *)0x0) goto LAB_00202da9;
    if (captureStdErr == captureStdOut) goto LAB_00202d97;
  }
  if (captureStdErr == captureStdOut && captureStdErr != (string *)0x0) {
    __assert_fail("!captureStdErr || captureStdErr != captureStdOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmSystemTools.cxx"
                  ,700,
                  "static bool cmSystemTools::RunSingleCommand(const std::vector<std::string> &, std::string *, std::string *, int *, const char *, OutputOption, cmDuration, Encoding)"
                 );
  }
  cmsysProcess_SetTimeout(cp,local_c0);
  cmsysProcess_Execute(cp);
  local_f8 = (void *)0x0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_108 = 0;
  local_118 = (void *)0x0;
  uStack_110 = 0;
  cmProcessOutput::cmProcessOutput(&local_149,encoding,0x400);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  if ((OVar7 != OUTPUT_PASSTHROUGH) &&
     (((OVar7 != OUTPUT_NONE || (captureStdErr != (string *)0x0)) ||
      (captureStdOut != (string *)0x0)))) {
LAB_00202e4e:
    while( true ) {
      iVar3 = cmsysProcess_WaitForData(cp,&local_140,&local_144,(double *)0x0);
      OVar7 = local_148;
      if (iVar3 < 1) break;
      if (0 < local_144) {
        lVar6 = 0;
        do {
          if (local_140[lVar6] == '\0') {
            local_140[lVar6] = ' ';
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < local_144);
      }
      if (iVar3 == 2) goto LAB_00202ede;
      if (iVar3 == 3) {
        if (local_148 != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&local_149,local_140,(long)local_144,&local_138,2);
          Stderr(&local_138);
        }
        if (captureStdErr != (string *)0x0) {
          pvVar9 = (vector<char,std::allocator<char>> *)&local_118;
          uVar8 = uStack_110;
          goto LAB_00202f28;
        }
      }
    }
    if (local_148 != OUTPUT_NONE) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      cmProcessOutput::DecodeText(&local_149,&local_50,&local_138,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (local_138._M_string_length != 0) {
        Stdout(&local_138);
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmProcessOutput::DecodeText(&local_149,&local_70,&local_138,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (local_138._M_string_length != 0) {
        Stderr(&local_138);
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (captureStdOut != (string *)0x0) {
    pcVar2 = (captureStdOut->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdOut,pcVar2,pcVar2 + captureStdOut->_M_string_length,local_f8,
               uStack_f0);
    pcVar2 = (captureStdOut->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + captureStdOut->_M_string_length);
    cmProcessOutput::DecodeText(&local_149,&local_90,captureStdOut,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (captureStdErr != (string *)0x0) {
    pcVar2 = (captureStdErr->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdErr,pcVar2,pcVar2 + captureStdErr->_M_string_length,local_118,
               uStack_110);
    pcVar2 = (captureStdErr->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + captureStdErr->_M_string_length);
    cmProcessOutput::DecodeText(&local_149,&local_b0,captureStdErr,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = cmsysProcess_GetState(cp);
  if (iVar3 == 4) {
    if (local_e0 == (int *)0x0) {
      iVar3 = cmsysProcess_GetExitValue(cp);
      bVar11 = iVar3 == 0;
    }
    else {
      iVar3 = cmsysProcess_GetExitValue(cp);
      *local_e0 = iVar3;
      bVar11 = true;
    }
  }
  else {
    iVar3 = cmsysProcess_GetState(cp);
    if (iVar3 == 2) {
      pcVar4 = cmsysProcess_GetExceptionString(cp);
      if (OVar7 != OUTPUT_NONE) {
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6bc390);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      if (captureStdErr != (string *)0x0 || captureStdOut != (string *)0x0) {
        if (captureStdErr != (string *)0x0) {
          captureStdOut = captureStdErr;
        }
        strlen(pcVar4);
        std::__cxx11::string::append((char *)captureStdOut,(ulong)pcVar4);
      }
    }
    else {
      iVar3 = cmsysProcess_GetState(cp);
      if (iVar3 == 1) {
        pcVar4 = cmsysProcess_GetErrorString(cp);
        if (OVar7 != OUTPUT_NONE) {
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6bc390);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
          std::ostream::put(-0x70);
          std::ostream::flush();
        }
        if (captureStdErr != (string *)0x0 || captureStdOut != (string *)0x0) {
          if (captureStdErr != (string *)0x0) {
            captureStdOut = captureStdErr;
          }
          strlen(pcVar4);
          std::__cxx11::string::append((char *)captureStdOut,(ulong)pcVar4);
        }
      }
      else {
        iVar3 = cmsysProcess_GetState(cp);
        bVar11 = true;
        if (iVar3 != 5) goto LAB_0020334f;
        if (OVar7 != OUTPUT_NONE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Process terminated due to timeout\n",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
          std::ostream::put(-0x70);
          std::ostream::flush();
        }
        if (captureStdErr != (string *)0x0) {
          std::__cxx11::string::append((char *)captureStdErr,0x54e78c);
        }
      }
    }
    bVar11 = false;
  }
LAB_0020334f:
  cmsysProcess_Delete(cp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_149);
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,local_108 - (long)local_118);
  }
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar11;
LAB_00202ede:
  if (local_148 != OUTPUT_NONE) {
    cmProcessOutput::DecodeText(&local_149,local_140,(long)local_144,&local_138,1);
    Stdout(&local_138);
  }
  if (captureStdOut != (string *)0x0) {
    pvVar9 = (vector<char,std::allocator<char>> *)&local_f8;
    uVar8 = uStack_f0;
LAB_00202f28:
    std::vector<char,std::allocator<char>>::_M_range_insert<char*>(pvVar9,uVar8);
  }
  goto LAB_00202e4e;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(command.size() + 1);
  for (std::string const& cmd : command) {
    argv.push_back(cmd.c_str());
  }
  argv.push_back(nullptr);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = nullptr;
    captureStdErr = nullptr;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = nullptr;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, nullptr)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata);
        }
        if (captureStdOut) {
          cmAppend(tempStdOut, data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata);
        }
        if (captureStdErr) {
          cmAppend(tempStdErr, data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata);
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata);
      }
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    } else if (captureStdOut) {
      captureStdOut->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    } else if (captureStdOut) {
      captureStdOut->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}